

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_ManSaveCuts(Nf_Man_t *p,Nf_Cut_t **pCuts,int nCuts,int fUseful)

{
  int iVar1;
  int iVar2;
  void *Entry;
  int *piVar3;
  int local_3c;
  int local_38;
  int nCutsNew;
  int nInts;
  int iCur;
  int *pPlace;
  int i;
  int fUseful_local;
  int nCuts_local;
  Nf_Cut_t **pCuts_local;
  Nf_Man_t *p_local;
  
  local_38 = 1;
  local_3c = 0;
  for (pPlace._4_4_ = 0; pPlace._4_4_ < nCuts; pPlace._4_4_ = pPlace._4_4_ + 1) {
    if ((fUseful == 0) || ((*(uint *)&pCuts[pPlace._4_4_]->field_0x10 >> 0x1a & 1) == 0)) {
      local_38 = (*(uint *)&pCuts[pPlace._4_4_]->field_0x10 >> 0x1b) + 1 + local_38;
      local_3c = local_3c + 1;
    }
  }
  if (0xffff < (int)((p->iCur & 0xffffU) + local_38)) {
    p->iCur = ((p->iCur >> 0x10) + 1) * 0x10000;
  }
  iVar1 = Vec_PtrSize(&p->vPages);
  if (iVar1 == p->iCur >> 0x10) {
    Entry = malloc(0x40000);
    Vec_PtrPush(&p->vPages,Entry);
  }
  iVar1 = p->iCur;
  p->iCur = local_38 + p->iCur;
  piVar3 = Nf_ManCutSet(p,iVar1);
  _nInts = piVar3 + 1;
  *piVar3 = local_3c;
  for (pPlace._4_4_ = 0; pPlace._4_4_ < nCuts; pPlace._4_4_ = pPlace._4_4_ + 1) {
    if ((fUseful == 0) || ((*(uint *)&pCuts[pPlace._4_4_]->field_0x10 >> 0x1a & 1) == 0)) {
      iVar2 = Nf_CutSetBoth(*(uint *)&pCuts[pPlace._4_4_]->field_0x10 >> 0x1b,
                            *(uint *)&pCuts[pPlace._4_4_]->field_0x10 & 0x3ffffff);
      *_nInts = iVar2;
      memcpy(_nInts + 1,pCuts[pPlace._4_4_]->pLeaves,
             (ulong)(*(uint *)&pCuts[pPlace._4_4_]->field_0x10 >> 0x1b) << 2);
      _nInts = _nInts + 1 + (int)(*(uint *)&pCuts[pPlace._4_4_]->field_0x10 >> 0x1b);
    }
  }
  return iVar1;
}

Assistant:

static inline int Nf_ManSaveCuts( Nf_Man_t * p, Nf_Cut_t ** pCuts, int nCuts, int fUseful )
{
    int i, * pPlace, iCur, nInts = 1, nCutsNew = 0;
    for ( i = 0; i < nCuts; i++ )
        if ( !fUseful || !pCuts[i]->Useless )
            nInts += pCuts[i]->nLeaves + 1, nCutsNew++;
    if ( (p->iCur & 0xFFFF) + nInts > 0xFFFF )
        p->iCur = ((p->iCur >> 16) + 1) << 16;
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> 16) )
        Vec_PtrPush( &p->vPages, ABC_ALLOC(int, (1<<16)) );
    iCur = p->iCur; p->iCur += nInts;
    pPlace = Nf_ManCutSet( p, iCur );
    *pPlace++ = nCutsNew;
    for ( i = 0; i < nCuts; i++ )
        if ( !fUseful || !pCuts[i]->Useless )
        {
            *pPlace++ = Nf_CutSetBoth( pCuts[i]->nLeaves, pCuts[i]->iFunc );
            memcpy( pPlace, pCuts[i]->pLeaves, sizeof(int) * pCuts[i]->nLeaves );
            pPlace += pCuts[i]->nLeaves;
        }
    return iCur;
}